

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config_format.hpp
# Opt level: O1

void lightconf::config_format::write_vector(scanner *sc,writer *wr,value_vector_type *vec)

{
  undefined4 uVar1;
  undefined4 uVar2;
  pointer pvVar3;
  pointer ptVar4;
  undefined4 uVar6;
  pointer pcVar5;
  undefined4 uVar7;
  double dVar8;
  undefined8 uVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  value *val;
  pointer pvVar16;
  bool bVar17;
  bool bVar18;
  scanner dummy_scanner;
  undefined1 local_190 [8];
  char *local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180;
  vector<lightconf::token,_std::allocator<lightconf::token>_> local_170;
  uint uStack_158;
  undefined4 uStack_154;
  undefined8 local_150;
  int local_148;
  _Any_data local_140;
  _Manager_type local_130;
  _Invoker_type p_Stack_128;
  int local_120;
  _Any_data local_118;
  _Manager_type local_108 [3];
  scanner *local_f0;
  string local_e8;
  value local_c8;
  
  pvVar16 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pvVar3 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pvVar16 == pvVar3) {
    iVar13 = 3;
  }
  else {
    iVar13 = 3;
    do {
      iVar11 = value_length(pvVar16,0x78);
      iVar13 = iVar13 + iVar11 + 2;
      pvVar16 = pvVar16 + 1;
    } while (pvVar16 != pvVar3);
  }
  iVar11 = wr->wrap_length;
  local_190 = (undefined1  [8])&local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"[ ","");
  std::__cxx11::string::_M_append((char *)wr,(ulong)local_190);
  wr->col = wr->col + (int)local_188;
  if (local_190 != (undefined1  [8])&local_180) {
    operator_delete((void *)local_190);
  }
  writer::indent(wr);
  if (iVar11 < iVar13) {
    writer::newline(wr);
  }
  scanner::expect(sc,'[',false);
  uVar15 = 0;
  local_f0 = sc;
  do {
    uVar14 = sc->cur_token_;
    ptVar4 = (sc->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(sc->tokens_).
                   super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar4 >> 6;
    do {
      uVar10 = (ulong)uVar14;
      if (uVar12 <= uVar10) break;
      uVar14 = uVar14 + 1;
    } while (ptVar4[uVar10].type - whitespace_token < 2);
    if (uVar12 == uVar10) {
      local_190._0_4_ = 7;
      local_188 = local_180._M_local_buf + 8;
      local_180._M_allocated_capacity = 0;
      local_180._M_local_buf[8] = '\0';
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffff00;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_158 = 0;
      uStack_154._0_1_ = false;
      uStack_154._1_3_ = 0;
    }
    else {
      local_190._0_4_ = ptVar4[uVar10].type;
      local_188 = local_180._M_local_buf + 8;
      pcVar5 = ptVar4[uVar10].string_value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar5,pcVar5 + ptVar4[uVar10].string_value._M_string_length);
      uVar1 = ptVar4[uVar10].line;
      uVar6 = ptVar4[uVar10].col;
      dVar8 = ptVar4[uVar10].number_value;
      uVar9 = (&ptVar4[uVar10].number_value)[1];
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = SUB84(dVar8,0);
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)uVar9;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
      sc = local_f0;
      uStack_158 = uVar1;
      uStack_154 = uVar6;
    }
    bVar17 = local_190._0_4_ == 4;
    bVar18 = (char)local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage == ']';
    if (local_188 != local_180._M_local_buf + 8) {
      operator_delete(local_188);
    }
    uVar14 = (uint)uVar15;
    pvVar16 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)._M_impl
              .super__Vector_impl_data._M_start;
    uVar12 = ((long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pvVar16 >> 3) *
             -0x79435e50d79435e5;
    if (bVar17 && bVar18) break;
    if (uVar12 < uVar15 || uVar12 - uVar15 == 0) {
      read_value(&local_c8,sc);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_c8.group_value_.order_);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_lightconf::value>_>_>
                   *)&local_c8.group_value_);
      std::vector<lightconf::value,_std::allocator<lightconf::value>_>::~vector
                (&local_c8.vector_value_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8.string_value_._M_dataplus._M_p != &local_c8.string_value_.field_2) {
        operator_delete(local_c8.string_value_._M_dataplus._M_p);
      }
    }
    else {
      write_value(sc,wr,pvVar16 + uVar15);
      uVar15 = (ulong)(uVar14 + 1);
    }
    uVar14 = sc->cur_token_;
    ptVar4 = (sc->tokens_).super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar12 = (long)(sc->tokens_).
                   super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
                   super__Vector_impl_data._M_finish - (long)ptVar4 >> 6;
    do {
      uVar10 = (ulong)uVar14;
      if (uVar12 <= uVar10) break;
      uVar14 = uVar14 + 1;
    } while (ptVar4[uVar10].type - whitespace_token < 2);
    if (uVar12 == uVar10) {
      local_190._0_4_ = 7;
      local_188 = local_180._M_local_buf + 8;
      local_180._M_allocated_capacity = 0;
      local_180._M_local_buf[8] = '\0';
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ =
           (uint)local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffff00;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_158 = 0;
      uStack_154._0_1_ = false;
      uStack_154._1_3_ = 0;
    }
    else {
      local_190._0_4_ = ptVar4[uVar10].type;
      local_188 = local_180._M_local_buf + 8;
      pcVar5 = ptVar4[uVar10].string_value._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_188,pcVar5,pcVar5 + ptVar4[uVar10].string_value._M_string_length);
      uVar2 = ptVar4[uVar10].line;
      uVar7 = ptVar4[uVar10].col;
      dVar8 = ptVar4[uVar10].number_value;
      uVar9 = (&ptVar4[uVar10].number_value)[1];
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = SUB84(dVar8,0);
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = (undefined4)((ulong)dVar8 >> 0x20);
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = (uint)uVar9;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = (undefined4)((ulong)uVar9 >> 0x20);
      uStack_158 = uVar2;
      uStack_154 = uVar7;
    }
    if ((local_190._0_4_ == 4) &&
       ((char)local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage == ']')) {
      pvVar16 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                _M_impl.super__Vector_impl_data._M_finish;
      pvVar3 = (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
               _M_impl.super__Vector_impl_data._M_start;
      if (local_188 != local_180._M_local_buf + 8) {
        operator_delete(local_188);
      }
      if (((long)pvVar16 - (long)pvVar3 >> 3) * -0x79435e50d79435e5 - uVar15 != 0)
      goto LAB_00115b1f;
      if (iVar13 <= iVar11) {
        local_190 = (undefined1  [8])&local_180;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190," ","");
        std::__cxx11::string::_M_append((char *)wr,(ulong)local_190);
        goto LAB_00115b68;
      }
    }
    else {
      if (local_188 != local_180._M_local_buf + 8) {
        operator_delete(local_188);
      }
LAB_00115b1f:
      if (iVar11 < iVar13) {
        writer::newline(wr);
      }
      else {
        local_190 = (undefined1  [8])&local_180;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_190,", ","");
        std::__cxx11::string::_M_append((char *)wr,(ulong)local_190);
LAB_00115b68:
        wr->col = wr->col + (int)local_188;
        if (local_190 != (undefined1  [8])&local_180) {
          operator_delete((void *)local_190);
        }
      }
    }
    scanner::expect(sc,',',true);
  } while( true );
  if (uVar15 <= uVar12 && uVar12 - uVar15 != 0) {
    do {
      uVar14 = uVar14 + 1;
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"0","");
      local_190 = (undefined1  [8])&local_180;
      local_188 = (char *)0x0;
      local_180._M_allocated_capacity = local_180._M_allocated_capacity & 0xffffffffffffff00;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
      uStack_158 = 0;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._0_4_ = 0;
      local_170.super__Vector_base<lightconf::token,_std::allocator<lightconf::token>_>._M_impl.
      super__Vector_impl_data._M_finish._4_4_ = 0;
      uStack_154._0_1_ = true;
      local_150._0_4_ = 0;
      local_150._4_4_ = 1;
      local_148 = 1;
      local_130 = (_Manager_type)0x0;
      p_Stack_128 = (_Invoker_type)0x0;
      local_140._M_unused._M_object = (void *)0x0;
      local_140._8_8_ = 0;
      local_120 = 0;
      std::
      function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_118,
                 (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)default_scanner_params);
      local_108[2]._0_4_ = default_scanner_params._32_4_;
      scanner::scan((scanner *)local_190,&local_e8,(scanner_params *)&local_118);
      if (local_108[0] != (_Manager_type)0x0) {
        (*local_108[0])(&local_118,&local_118,__destroy_functor);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p);
      }
      write_value((scanner *)local_190,wr,
                  (vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                  _M_impl.super__Vector_impl_data._M_start + uVar15);
      if (uVar15 < ((long)(vec->
                          super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(vec->
                          super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>).
                          _M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5 - 1U)
      {
        if (iVar11 < iVar13) {
          writer::newline(wr);
        }
        else {
          local_118._M_unused._M_object = local_108;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,", ","");
          std::__cxx11::string::_M_append((char *)wr,local_118._M_unused._M_member_pointer);
LAB_00115d9d:
          wr->col = wr->col + local_118._8_4_;
          if ((_Manager_type *)local_118._M_unused._0_8_ != local_108) {
            operator_delete(local_118._M_unused._M_object);
          }
        }
      }
      else if (iVar13 <= iVar11) {
        local_118._M_unused._M_object = local_108;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_118," ","");
        std::__cxx11::string::_M_append((char *)wr,local_118._M_unused._M_member_pointer);
        goto LAB_00115d9d;
      }
      if (local_130 != (_Manager_type)0x0) {
        (*local_130)(&local_140,&local_140,__destroy_functor);
      }
      std::vector<lightconf::token,_std::allocator<lightconf::token>_>::~vector(&local_170);
      if (local_190 != (undefined1  [8])&local_180) {
        operator_delete((void *)local_190);
      }
      uVar15 = (ulong)uVar14;
      uVar12 = ((long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(vec->super__Vector_base<lightconf::value,_std::allocator<lightconf::value>_>)
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5;
    } while (uVar15 <= uVar12 && uVar12 - uVar15 != 0);
  }
  std::deque<int,_std::allocator<int>_>::pop_back(&(wr->tabstops).c);
  if (iVar11 < iVar13) {
    writer::newline(wr);
  }
  scanner::expect(sc,']',false);
  local_190 = (undefined1  [8])&local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"]","");
  std::__cxx11::string::_M_append((char *)wr,(ulong)local_190);
  wr->col = wr->col + (int)local_188;
  if (local_190 != (undefined1  [8])&local_180) {
    operator_delete((void *)local_190);
  }
  return;
}

Assistant:

inline void write_vector(scanner& sc, writer& wr, const value_vector_type& vec) {
    bool wrap = vector_length(vec) > wr.wrap_length;

    wr.append("[ ");
    wr.indent();
    if (wrap) {
        wr.newline();
    }
    sc.expect('[');

    unsigned int vals_read = 0;
    while (!sc.peek_token().is_char(']')) {
        if (vals_read < vec.size()) {
            write_value(sc, wr, vec[vals_read]);
            vals_read++;
        } else {
            read_value(sc);
        }

        bool terminate = sc.peek_token().is_char(']') && vals_read == vec.size();
        if (!terminate) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
        sc.expect(',', true);
    }

    for (unsigned int i = vals_read; i < vec.size(); i++) {
        scanner dummy_scanner = make_scanner("0");
        write_value(dummy_scanner, wr, vec[i]);
        if (i < vec.size() - 1) {
            if (wrap) {
                wr.newline();
            } else {
                wr.append(", ");
            }
        } else if (!wrap) {
            wr.append(" ");
        }
    }

    wr.unindent();
    if (wrap) {
        wr.newline();
    }

    sc.expect(']');
    wr.append("]");
}